

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioaWriteAig.c
# Opt level: O0

void Ioa_WriteAigerEncodeStr(Vec_Str_t *vStr,uint x)

{
  undefined4 local_14;
  uchar ch;
  uint x_local;
  Vec_Str_t *vStr_local;
  
  for (local_14 = x; (local_14 & 0xffffff80) != 0; local_14 = local_14 >> 7) {
    Vec_StrPush(vStr,(byte)local_14 & 0x7f | 0x80);
  }
  Vec_StrPush(vStr,(byte)local_14);
  return;
}

Assistant:

void Ioa_WriteAigerEncodeStr( Vec_Str_t * vStr, unsigned x )
{
    unsigned char ch;
    while (x & ~0x7f)
    {
        ch = (x & 0x7f) | 0x80;
//        putc (ch, file);
//        pBuffer[Pos++] = ch;
        Vec_StrPush( vStr, ch );
        x >>= 7;
    }
    ch = x;
//    putc (ch, file);
//    pBuffer[Pos++] = ch;
    Vec_StrPush( vStr, ch );
}